

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_ngram.c
# Opt level: O2

void ReadUTF8_test(FILE *fp)

{
  uint uVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  size_t sVar6;
  size_t sVar7;
  size_t sVar8;
  char *pcVar9;
  ulong uVar10;
  ulong local_438;
  size_t gram_nums [64];
  char *words [64];
  
  fgets(iobuf,200000,(FILE *)fp);
  uVar1 = atoi(iobuf);
  uVar2 = Ngram_order(ngram);
  if (uVar2 == uVar1) {
    uVar10 = 0;
    do {
      if (uVar1 == uVar10) {
        uVar2 = Ngram_word_num(ngram);
        if (local_438 == uVar2) {
          goto LAB_0010237d;
        }
        pcVar9 = "Ngram_word_num(ngram) == gram_nums[0]";
        uVar1 = 0x23;
        goto LAB_00102488;
      }
      fgets(iobuf,200000,(FILE *)fp);
      sVar6 = atol(iobuf);
      gram_nums[uVar10 - 1] = sVar6;
      uVar10 = uVar10 + 1;
      sVar7 = Ngram_gram_num(ngram,(uint32_t)uVar10);
    } while (sVar7 == sVar6);
    pcVar9 = "Ngram_gram_num(ngram, i+1) == gram_nums[i]";
    uVar1 = 0x21;
  }
  else {
    pcVar9 = "Ngram_order(ngram) == order";
    uVar1 = 0x1c;
  }
  goto LAB_00102488;
  while( true ) {
    uVar2 = Ngram_bow2(ngram,(char **)(gram_nums + 0x3f),uVar2);
    if (uVar2 != uVar4) break;
LAB_0010237d:
    pcVar9 = fgets(iobuf,200000,(FILE *)fp);
    if (pcVar9 == (char *)0x0) {
      return;
    }
    sVar8 = strlen(iobuf);
    if ((&DAT_001080df)[sVar8] == '\n') {
      (&DAT_001080df)[sVar8] = 0;
    }
    pcVar9 = strtok(iobuf,"\t");
    uVar2 = atoi(pcVar9);
    uVar1 = uVar2;
    if ((int)uVar2 < 1) {
      uVar1 = 0;
    }
    uVar10 = 0;
    while( true ) {
      pcVar9 = strtok((char *)0x0,"\t");
      if (uVar1 == uVar10) break;
      gram_nums[uVar10 + 0x3f] = (size_t)pcVar9;
      uVar10 = uVar10 + 1;
    }
    uVar3 = atoi(pcVar9);
    pcVar9 = strtok((char *)0x0,"\t");
    uVar4 = atoi(pcVar9);
    uVar5 = Ngram_prob2(ngram,(char **)(gram_nums + 0x3f),uVar2);
    if (uVar5 != uVar3) {
      pcVar9 = "Ngram_prob2(ngram,(const char**)words,order) == prob";
      uVar1 = 0x32;
      goto LAB_00102488;
    }
  }
  pcVar9 = "Ngram_bow2(ngram, (const char**)words,order) == bow";
  uVar1 = 0x33;
LAB_00102488:
  __assert_fail(pcVar9,
                "/workspace/llm4binary/github/license_all_cmakelists_25/chenkovsky[P]ngram/test_ngram.c"
                ,uVar1,"void ReadUTF8_test(FILE *)");
}

Assistant:

void ReadUTF8_test(FILE* fp)
{
    fgets((char*)iobuf, sizeof(iobuf), fp);
    int order = atoi(iobuf);
    assert(Ngram_order(ngram) == order);
    size_t gram_nums[MAX_ORDER];
    for (uint32_t i = 0;i<order;i++) {
         fgets((char*)iobuf, sizeof(iobuf), fp);
         gram_nums[i] = atol(iobuf);
         assert(Ngram_gram_num(ngram, i+1) == gram_nums[i]);
    }
    assert(Ngram_word_num(ngram) == gram_nums[0]);
    char* words[MAX_ORDER];
    while( fgets((char*)iobuf, sizeof(iobuf), fp))
    {
        size_t len = strlen(iobuf);
        if (iobuf[len-1] == '\n') {
            iobuf[len-1] = 0;
        }
        //order\tword\t...\tprob\tbow
        int order = atoi(strtok(iobuf, "\t"));
        for (int i = 0;i<order;i++) {
            words[i] = strtok(NULL,"\t");
        }
        uint32_t prob = atoi(strtok(NULL, "\t"));
        uint32_t bow = atoi(strtok(NULL, "\t"));
        assert(Ngram_prob2(ngram,(const char**)words,order) == prob);
        assert(Ngram_bow2(ngram, (const char**)words,order) == bow);
    }
}